

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall jaegertracing::net::URI_testPrint_Test::TestBody(URI_testPrint_Test *this)

{
  char *pcVar1;
  allocator local_230 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [4];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::__cxx11::string::string((string *)&gtest_ar,"localhost",local_230);
  jaegertracing::net::URI::parse((string *)local_208);
  URI::print<std::ostream>((URI *)local_208,(basic_ostream<char,_std::char_traits<char>_> *)&oss);
  URI::~URI((URI *)local_208);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[59],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"{ scheme=\\\"\\\"\" \", host=\\\"\\\"\" \", port=0\" \", path=\\\"localhost\\\"\" \", query=\\\"\\\" }\""
             ,"oss.str()",
             (char (*) [59])"{ scheme=\"\", host=\"\", port=0, path=\"localhost\", query=\"\" }",
             local_208);
  std::__cxx11::string::~string((string *)local_208);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_208);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_230,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_230,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_208);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return;
}

Assistant:

TEST(URI, testPrint)
{
    std::ostringstream oss;
    oss << URI::parse("localhost");
    ASSERT_EQ(
        "{ scheme=\"\""
        ", host=\"\""
        ", port=0"
        ", path=\"localhost\""
        ", query=\"\" }",
        oss.str());
}